

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O1

fourcc_t EBML_IdFromBuffer(uint8_t *PossibleId,int8_t IdLength)

{
  uint uVar1;
  long lVar2;
  undefined3 in_register_00000031;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000031,IdLength);
  uVar1 = (uint)*PossibleId;
  if (iVar3 != 1) {
    if (iVar3 == 3) {
      uVar1 = (uint)PossibleId[1] << 8 | uVar1 << 0x10;
      lVar2 = 2;
    }
    else if (iVar3 == 2) {
      uVar1 = (uint)*PossibleId << 8;
      lVar2 = 1;
    }
    else {
      uVar1 = (uint)PossibleId[2] << 8 | (uint)PossibleId[1] << 0x10 | uVar1 << 0x18;
      lVar2 = 3;
    }
    uVar1 = PossibleId[lVar2] | uVar1;
  }
  return uVar1;
}

Assistant:

static fourcc_t EBML_IdFromBuffer(const uint8_t *PossibleId, int8_t IdLength)
{
    if (IdLength == 1)
        return FOURCCBE(0,0,0,PossibleId[0]);
    if (IdLength == 2)
        return FOURCCBE(0,0,PossibleId[0],PossibleId[1]);
    if (IdLength == 3)
        return FOURCCBE(0,PossibleId[0],PossibleId[1],PossibleId[2]);
    return FOURCCBE(PossibleId[0],PossibleId[1],PossibleId[2],PossibleId[3]);
}